

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

Json __thiscall JFSON::anon_unknown_21::JsonParser::parse_json(JsonParser *this,int depth)

{
  size_t *this_00;
  mapped_type *this_01;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  undefined4 in_register_00000034;
  JsonParser *this_02;
  Json JVar2;
  JFSON local_2f0 [32];
  string local_2d0 [32];
  JFSON local_2b0 [32];
  string local_290 [32];
  undefined1 local_270 [24];
  vector<JFSON::Json,_std::allocator<JFSON::Json>_> data_1;
  string local_228 [32];
  undefined1 local_208 [48];
  string local_1d8 [32];
  JsonParser local_1b8 [8];
  string key;
  JFSON local_198 [32];
  string local_178 [36];
  int local_154;
  undefined1 local_150 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
  data;
  Json local_100;
  allocator local_e9;
  Json local_e8 [2];
  Json local_c8;
  allocator local_b1;
  Json local_b0 [2];
  Json local_90;
  allocator local_79;
  Json local_78 [2];
  char local_55;
  char ch;
  allocator local_41;
  string local_40 [40];
  JsonParser *pJStack_18;
  int depth_local;
  JsonParser *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_02 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  pJStack_18 = this_02;
  this_local = this;
  if (in_EDX < 0xc9) {
    local_55 = get_next_token(this_02);
    if ((this_02->failed & 1U) == 0) {
      if ((local_55 == '-') || (('/' < local_55 && (local_55 < ':')))) {
        this_02->i = this_02->i - 1;
        JVar2 = parse_number(this);
        _Var1._M_pi = JVar2.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else if (local_55 == 't') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_78,"true",&local_79);
        Json::Json(&local_90,true);
        expect(this,(string *)this_02,local_78);
        Json::~Json(&local_90);
        std::__cxx11::string::~string((string *)local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        _Var1._M_pi = extraout_RDX_01;
      }
      else if (local_55 == 'f') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_b0,"false",&local_b1);
        Json::Json(&local_c8,false);
        expect(this,(string *)this_02,local_b0);
        Json::~Json(&local_c8);
        std::__cxx11::string::~string((string *)local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        _Var1._M_pi = extraout_RDX_02;
      }
      else if (local_55 == 'n') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_e8,"null",&local_e9);
        Json::Json(&local_100);
        expect(this,(string *)this_02,local_e8);
        Json::~Json(&local_100);
        std::__cxx11::string::~string((string *)local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        _Var1._M_pi = extraout_RDX_03;
      }
      else if (local_55 == '\"') {
        this_00 = &data._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_((JsonParser *)this_00);
        Json::Json((Json *)this,(string *)this_00);
        std::__cxx11::string::~string
                  ((string *)&data._M_t._M_impl.super__Rb_tree_header._M_node_count);
        _Var1._M_pi = extraout_RDX_04;
      }
      else if (local_55 == '{') {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
               *)local_150);
        local_55 = get_next_token(this_02);
        if (local_55 == '}') {
          Json::Json((Json *)this,(object *)local_150);
          local_154 = 1;
        }
        else {
          do {
            if (local_55 != '\"') {
              esc_abi_cxx11_(local_198,local_55);
              std::operator+((char *)local_178,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "expected \'\"\' in object, got ");
              fail(this,(string *)this_02);
              std::__cxx11::string::~string(local_178);
              std::__cxx11::string::~string((string *)local_198);
              local_154 = 1;
              goto LAB_0010631a;
            }
            (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_(local_1b8);
            if ((this_02->failed & 1U) == 0) {
              local_55 = get_next_token(this_02);
              if (local_55 == ':') {
                parse_json((JsonParser *)local_208,depth);
                this_01 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                                        *)local_150,(key_type *)local_1b8);
                Json::operator=(this_01,(Json *)local_208);
                Json::~Json((Json *)local_208);
                if ((this_02->failed & 1U) == 0) {
                  local_55 = get_next_token(this_02);
                  if (local_55 == '}') {
                    local_154 = 3;
                  }
                  else if (local_55 == ',') {
                    local_55 = get_next_token(this_02);
                    local_154 = 0;
                  }
                  else {
                    esc_abi_cxx11_((JFSON *)&data_1.
                                             super__Vector_base<JFSON::Json,_std::allocator<JFSON::Json>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   local_55);
                    std::operator+((char *)local_228,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"expected \',\' in object, got ");
                    fail(this,(string *)this_02);
                    std::__cxx11::string::~string(local_228);
                    std::__cxx11::string::~string
                              ((string *)
                               &data_1.super__Vector_base<JFSON::Json,_std::allocator<JFSON::Json>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    local_154 = 1;
                  }
                }
                else {
                  Json::Json((Json *)this);
                  local_154 = 1;
                }
              }
              else {
                esc_abi_cxx11_((JFSON *)(local_208 + 0x10),local_55);
                std::operator+((char *)local_1d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "expected \':\' in object, got ");
                fail(this,(string *)this_02);
                std::__cxx11::string::~string(local_1d8);
                std::__cxx11::string::~string((string *)(local_208 + 0x10));
                local_154 = 1;
              }
            }
            else {
              Json::Json((Json *)this);
              local_154 = 1;
            }
            std::__cxx11::string::~string((string *)local_1b8);
          } while (local_154 == 0);
          if (local_154 == 3) {
            Json::Json((Json *)this,(object *)local_150);
            local_154 = 1;
          }
        }
LAB_0010631a:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                *)local_150);
        _Var1._M_pi = extraout_RDX_05;
      }
      else if (local_55 == '[') {
        std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::vector
                  ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)(local_270 + 0x10));
        local_55 = get_next_token(this_02);
        if (local_55 == ']') {
          Json::Json((Json *)this,(array *)(local_270 + 0x10));
        }
        else {
          while( true ) {
            this_02->i = this_02->i - 1;
            parse_json((JsonParser *)local_270,depth);
            std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::push_back
                      ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)(local_270 + 0x10),
                       (value_type *)local_270);
            Json::~Json((Json *)local_270);
            if ((this_02->failed & 1U) != 0) break;
            local_55 = get_next_token(this_02);
            if (local_55 == ']') {
              Json::Json((Json *)this,(array *)(local_270 + 0x10));
              goto LAB_0010655a;
            }
            if (local_55 != ',') {
              esc_abi_cxx11_(local_2b0,local_55);
              std::operator+((char *)local_290,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "expected \',\' in list, got ");
              fail(this,(string *)this_02);
              std::__cxx11::string::~string(local_290);
              std::__cxx11::string::~string((string *)local_2b0);
              goto LAB_0010655a;
            }
            local_55 = get_next_token(this_02);
          }
          Json::Json((Json *)this);
        }
LAB_0010655a:
        local_154 = 1;
        std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::~vector
                  ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)(local_270 + 0x10));
        _Var1._M_pi = extraout_RDX_06;
      }
      else {
        esc_abi_cxx11_(local_2f0,local_55);
        std::operator+((char *)local_2d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "expected value, got ");
        fail(this,(string *)this_02);
        std::__cxx11::string::~string(local_2d0);
        std::__cxx11::string::~string((string *)local_2f0);
        _Var1._M_pi = extraout_RDX_07;
      }
    }
    else {
      Json::Json((Json *)this);
      _Var1._M_pi = extraout_RDX_00;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"exceeded maximum nesting depth",&local_41);
    fail(this,(string *)this_02);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    _Var1._M_pi = extraout_RDX;
  }
  JVar2.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  JVar2.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar2.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }